

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_is_closing(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uv_loop_t *unaff_RBX;
  char *pcVar4;
  char *handle_00;
  uv_timer_t handle;
  undefined1 auStack_1f0 [168];
  uv_timer_t uStack_148;
  code *pcStack_b0;
  
  pcStack_b0 = (code *)0x175209;
  puVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x175216;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    unaff_RBX = (uv_loop_t *)&stack0xffffffffffffff60;
    pcStack_b0 = (code *)0x175229;
    uv_close((uv_handle_t *)unaff_RBX,(uv_close_cb)0x0);
    pcStack_b0 = (code *)0x175242;
    iVar1 = uv_timer_start((uv_timer_t *)unaff_RBX,never_cb,100,100);
    if (iVar1 != -0x16) goto LAB_0017528b;
    pcStack_b0 = (code *)0x17524c;
    unaff_RBX = uv_default_loop();
    pcStack_b0 = (code *)0x175260;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_b0 = (code *)0x17526a;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_b0 = (code *)0x17526f;
    puVar2 = uv_default_loop();
    pcStack_b0 = (code *)0x175277;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_b0 = (code *)0x17528b;
    run_test_timer_is_closing_cold_1();
LAB_0017528b:
    pcStack_b0 = (code *)0x175290;
    run_test_timer_is_closing_cold_2();
  }
  pcStack_b0 = run_test_timer_null_callback;
  run_test_timer_is_closing_cold_3();
  auStack_1f0._152_8_ = 0x1752a2;
  pcStack_b0 = (code *)unaff_RBX;
  puVar2 = uv_default_loop();
  auStack_1f0._152_8_ = 0x1752af;
  iVar1 = uv_timer_init(puVar2,&uStack_148);
  if (iVar1 == 0) {
    auStack_1f0._152_8_ = 0x1752c9;
    iVar1 = uv_timer_start(&uStack_148,(uv_timer_cb)0x0,100,100);
    if (iVar1 != -0x16) goto LAB_00175312;
    auStack_1f0._152_8_ = 0x1752d3;
    unaff_RBX = uv_default_loop();
    auStack_1f0._152_8_ = 0x1752e7;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_1f0._152_8_ = 0x1752f1;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    auStack_1f0._152_8_ = 0x1752f6;
    puVar2 = uv_default_loop();
    auStack_1f0._152_8_ = 0x1752fe;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    auStack_1f0._152_8_ = 0x175312;
    run_test_timer_null_callback_cold_1();
LAB_00175312:
    auStack_1f0._152_8_ = 0x175317;
    run_test_timer_null_callback_cold_2();
  }
  auStack_1f0._152_8_ = run_test_timer_early_check;
  run_test_timer_null_callback_cold_3();
  auStack_1f0._152_8_ = unaff_RBX;
  puVar2 = uv_default_loop();
  uVar3 = uv_now(puVar2);
  timer_early_check_expected_time = uVar3 + 10;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)auStack_1f0);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)auStack_1f0;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,timer_early_check_cb,10,0);
    if (iVar1 != 0) goto LAB_001753e8;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001753ed;
    uv_close((uv_handle_t *)auStack_1f0,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001753f7;
    }
  }
  else {
    run_test_timer_early_check_cold_1();
LAB_001753e8:
    run_test_timer_early_check_cold_2();
LAB_001753ed:
    run_test_timer_early_check_cold_3();
  }
  run_test_timer_early_check_cold_4();
LAB_001753f7:
  run_test_timer_early_check_cold_5();
  uVar3 = uv_hrtime();
  if (timer_early_check_expected_time <= uVar3 / 1000000) {
    return extraout_EAX;
  }
  timer_early_check_cb_cold_1();
  pcVar4 = "ONCE_CLOSE_CB";
  puts("ONCE_CLOSE_CB");
  if (puVar2 == (uv_loop_t *)0x0) {
    once_close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active((uv_handle_t *)puVar2);
    pcVar4 = (char *)puVar2;
    if (iVar1 == 0) {
      once_close_cb_called = once_close_cb_called + 1;
      return 0;
    }
  }
  once_close_cb_cold_1();
  handle_00 = "REPEAT_CLOSE_CB";
  iVar1 = puts("REPEAT_CLOSE_CB");
  if ((uv_loop_t *)pcVar4 != (uv_loop_t *)0x0) {
    repeat_close_cb_called = repeat_close_cb_called + 1;
    return iVar1;
  }
  repeat_close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle_00);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(timer_is_closing) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  uv_close((uv_handle_t *)&handle, NULL);

  ASSERT(UV_EINVAL == uv_timer_start(&handle, never_cb, 100, 100));

  MAKE_VALGRIND_HAPPY();
  return 0;
}